

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatNode
                (StringBuilder *sb,uint32_t logOptions,CodeBuilder *cb,CBNode *node_)

{
  Error EVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t logOptions_00;
  char *pcVar4;
  FuncDetail *in_R8;
  VirtReg **in_R9;
  CBData *node;
  
  logOptions_00 = logOptions;
  if (node_->_position != 0) {
    logOptions_00 = 0x13215f;
    EVar1 = StringBuilder::appendFormat(sb,"<%04u> ");
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  uVar3 = (ulong)node_->_type;
  switch(node_->_type) {
  case '\x01':
  case '\x12':
    EVar1 = X86Logging::formatInstruction
                      (sb,logOptions,&cb->super_CodeEmitter,
                       (uint)(cb->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,
                       (uint)*(ushort *)&node_[1]._prev,*(uint32_t *)((long)&node_[1]._prev + 4),
                       (Operand_ *)&node_[1]._next,(Operand_ *)node_[1]._inlineComment,
                       (uint)node_->_opCount);
    break;
  case '\x02':
    uVar2 = node_[1]._position;
    pcVar4 = ".embed (%u bytes)";
    goto LAB_00116512;
  case '\x03':
    pcVar4 = "data";
    if (*(int *)&node_[1]._prev == 0) {
      pcVar4 = "code";
    }
    EVar1 = StringBuilder::appendFormat
                      (sb,".align %u (%s)",(ulong)*(uint *)((long)&node_[1]._prev + 4),pcVar4);
    break;
  case '\x04':
    uVar2 = *(int *)&node_[1]._prev - 0x100;
    pcVar4 = "L%u:";
LAB_00116512:
    uVar3 = (ulong)uVar2;
LAB_0011653e:
    EVar1 = StringBuilder::appendFormat(sb,pcVar4,uVar3);
    break;
  default:
    pcVar4 = "[unknown (type=%u)]";
    goto LAB_0011653e;
  case '\a':
    EVar1 = StringBuilder::appendFormat(sb,"; %s",node_->_inlineComment);
    break;
  case '\b':
    pcVar4 = "[sentinel]";
    goto LAB_0011651e;
  case '\x10':
    EVar1 = formatLabel(sb,logOptions_00,&cb->super_CodeEmitter,*(uint32_t *)&node_[1]._prev);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString(sb,1,": [",0xffffffffffffffff);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = formatFuncRets((asmjit *)sb,(StringBuilder *)(ulong)logOptions,(uint32_t)cb,
                           (CodeEmitter *)&node_[1]._type,in_R8,in_R9);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString(sb,1,"]",0xffffffffffffffff);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString(sb,1,"(",0xffffffffffffffff);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = formatFuncArgs((asmjit *)sb,(StringBuilder *)(ulong)logOptions,(uint32_t)cb,
                           (CodeEmitter *)&node_[1]._type,*(FuncDetail **)&node_[8]._type,in_R9);
    if (EVar1 != 0) {
      return EVar1;
    }
    pcVar4 = ")";
    goto LAB_0011651e;
  case '\x11':
    pcVar4 = "[ret]";
LAB_0011651e:
    EVar1 = StringBuilder::_opString(sb,1,pcVar4,0xffffffffffffffff);
  }
  if (EVar1 == 0) {
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error Logging::formatNode(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeBuilder* cb,
  const CBNode* node_) noexcept {

  if (node_->hasPosition())
    ASMJIT_PROPAGATE(sb.appendFormat("<%04u> ", node_->getPosition()));

  switch (node_->getType()) {
    case CBNode::kNodeInst: {
      const CBInst* node = node_->as<CBInst>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }

    case CBNode::kNodeLabel: {
      const CBLabel* node = node_->as<CBLabel>();
      ASMJIT_PROPAGATE(sb.appendFormat("L%u:", Operand::unpackId(node->getId())));
      break;
    }

    case CBNode::kNodeData: {
      const CBData* node = node_->as<CBData>();
      ASMJIT_PROPAGATE(sb.appendFormat(".embed (%u bytes)", node->getSize()));
      break;
    }

    case CBNode::kNodeAlign: {
      const CBAlign* node = node_->as<CBAlign>();
      ASMJIT_PROPAGATE(
        sb.appendFormat(".align %u (%s)",
          node->getAlignment(),
          node->getMode() == kAlignCode ? "code" : "data"));
      break;
    }

    case CBNode::kNodeComment: {
      const CBComment* node = node_->as<CBComment>();
      ASMJIT_PROPAGATE(sb.appendFormat("; %s", node->getInlineComment()));
      break;
    }

    case CBNode::kNodeSentinel: {
      ASMJIT_PROPAGATE(sb.appendString("[sentinel]"));
      break;
    }

#if !defined(ASMJIT_DISABLE_COMPILER)
    case CBNode::kNodeFunc: {
      const CCFunc* node = node_->as<CCFunc>();
      ASMJIT_PROPAGATE(formatLabel(sb, logOptions, cb, node->getId()));

      ASMJIT_PROPAGATE(sb.appendString(": ["));
      ASMJIT_PROPAGATE(formatFuncRets(sb, logOptions, cb, node->getDetail(), nullptr));
      ASMJIT_PROPAGATE(sb.appendString("]"));

      ASMJIT_PROPAGATE(sb.appendString("("));
      ASMJIT_PROPAGATE(formatFuncArgs(sb, logOptions, cb, node->getDetail(), node->getArgs()));
      ASMJIT_PROPAGATE(sb.appendString(")"));
      break;
    }

    case CBNode::kNodeFuncExit: {
      ASMJIT_PROPAGATE(sb.appendString("[ret]"));
      break;
    }

    case CBNode::kNodeFuncCall: {
      const CCFuncCall* node = node_->as<CCFuncCall>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }
#endif // !ASMJIT_DISABLE_COMPILER

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[unknown (type=%u)]", node_->getType()));
      break;
    }
  }

  return kErrorOk;
}